

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

S2Point * __thiscall
S2Builder::GetCoverageEndpoint
          (S2Point *__return_storage_ptr__,S2Builder *this,S2Point *p,S2Point *x,S2Point *y,
          S2Point *n)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar4 = n->c_[0];
  dVar5 = n->c_[1];
  dVar14 = n->c_[1];
  dVar15 = n->c_[2];
  dVar6 = p->c_[0];
  dVar7 = p->c_[1];
  dVar8 = p->c_[1];
  dVar9 = p->c_[2];
  dVar1 = p->c_[2];
  dVar11 = n->c_[2];
  dVar3 = 1.0 - this->edge_snap_radius_sin2_;
  dVar12 = dVar4 * dVar4 + dVar5 * dVar5 + dVar11 * dVar11;
  dVar13 = dVar7 * dVar5 + dVar4 * dVar6 + 0.0 + dVar1 * dVar11;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar10 = this->edge_snap_radius_sin2_ * dVar12 - dVar13 * dVar13;
  if (dVar10 <= 0.0) {
    dVar10 = 0.0;
  }
  dVar10 = SQRT(dVar10);
  dVar14 = (dVar1 * dVar14 - dVar11 * dVar8) * dVar10 + dVar3 * (dVar12 * dVar6 - dVar13 * dVar4);
  dVar15 = (dVar6 * dVar15 - dVar4 * dVar9) * dVar10 + dVar3 * (dVar12 * dVar7 - dVar13 * dVar5);
  dVar11 = dVar10 * (dVar7 * dVar4 - dVar5 * dVar6) + (dVar1 * dVar12 - dVar11 * dVar13) * dVar3;
  dVar1 = SQRT(dVar11 * dVar11 + dVar15 * dVar15 + dVar14 * dVar14);
  dVar1 = (double)(~-(ulong)(dVar1 != 0.0) & (ulong)dVar1 |
                  (ulong)(1.0 / dVar1) & -(ulong)(dVar1 != 0.0));
  auVar2._8_4_ = SUB84(dVar1 * dVar15,0);
  auVar2._0_8_ = dVar1 * dVar14;
  auVar2._12_4_ = (int)((ulong)(dVar1 * dVar15) >> 0x20);
  *(undefined1 (*) [16])__return_storage_ptr__->c_ = auVar2;
  __return_storage_ptr__->c_[2] = dVar1 * dVar11;
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Builder::GetCoverageEndpoint(const S2Point& p, const S2Point& x,
                                       const S2Point& y, const S2Point& n)
    const {
  // Consider the plane perpendicular to P that cuts off a spherical cap of
  // radius snap_radius().  This plane intersects the plane through the edge
  // XY (perpendicular to N) along a line, and that line intersects the unit
  // sphere at two points Q and R, and we want to return the point R that is
  // further along the edge XY toward Y.
  //
  // Let M be the midpoint of QR.  This is the point along QR that is closest
  // to P.  We can now express R as the sum of two perpendicular vectors OM
  // and MR in the plane XY.  Vector MR is in the direction N x P, while
  // vector OM is in the direction (N x P) x N, where N = X x Y.
  //
  // The length of OM can be found using the Pythagorean theorem on triangle
  // OPM, and the length of MR can be found using the Pythagorean theorem on
  // triangle OMR.
  //
  // In the calculations below, we save some work by scaling all the vectors
  // by n.CrossProd(p).Norm2(), and normalizing at the end.
  double n2 = n.Norm2();
  double nDp = n.DotProd(p);
  S2Point nXp = n.CrossProd(p);
  S2Point nXpXn = n2 * p - nDp * n;
  Vector3_d om = sqrt(1 - edge_snap_radius_sin2_) * nXpXn;
  double mr2 = edge_snap_radius_sin2_ * n2 - nDp * nDp;

  // MR is constructed so that it points toward Y (rather than X).
  Vector3_d mr = sqrt(max(0.0, mr2)) * nXp;
  return (om + mr).Normalize();
}